

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cc
# Opt level: O2

void __thiscall TempFile::~TempFile(TempFile *this)

{
  remove(*(char **)this);
  std::__cxx11::string::~string((string *)this);
  return;
}

Assistant:

TempFile::~TempFile() {
  std::remove(name_.c_str());
}